

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::Compiler::CombinedImageSamplerUsageHandler::CombinedImageSamplerUsageHandler
          (CombinedImageSamplerUsageHandler *this,Compiler *compiler_,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *dref_combined_samplers_)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *dref_combined_samplers__local;
  Compiler *compiler__local;
  CombinedImageSamplerUsageHandler *this_local;
  
  OpcodeHandler::OpcodeHandler(&this->super_OpcodeHandler);
  (this->super_OpcodeHandler)._vptr_OpcodeHandler =
       (_func_int **)&PTR__CombinedImageSamplerUsageHandler_01411430;
  this->compiler = compiler_;
  this->dref_combined_samplers = dref_combined_samplers_;
  ::std::
  unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::unordered_map(&this->dependency_hierarchy);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->comparison_ids);
  this->need_subpass_input = false;
  this->need_subpass_input_ms = false;
  return;
}

Assistant:

CombinedImageSamplerUsageHandler(Compiler &compiler_,
		                                 const std::unordered_set<uint32_t> &dref_combined_samplers_)
		    : compiler(compiler_)
		    , dref_combined_samplers(dref_combined_samplers_)
		{
		}